

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::ChangeDimension(ON_NurbsSurface *this,int desired_dimension)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  int iVar6;
  int local_74;
  int local_70;
  int local_6c;
  int local_5c;
  int local_58;
  int new_stride1;
  int new_stride0;
  int cv_size;
  int old_stride1;
  int old_stride0;
  double *new_cv;
  double *old_cv;
  double *cv;
  int local_28;
  int k;
  int j;
  int i;
  bool rc;
  int desired_dimension_local;
  ON_NurbsSurface *this_local;
  
  if (desired_dimension < 1) {
    this_local._7_1_ = false;
  }
  else if (desired_dimension == this->m_dim) {
    this_local._7_1_ = true;
  }
  else {
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
    if (desired_dimension < this->m_dim) {
      if (this->m_is_rat != 0) {
        for (k = 0; k < this->m_cv_count[0]; k = k + 1) {
          for (local_28 = 0; local_28 < this->m_cv_count[1]; local_28 = local_28 + 1) {
            pdVar4 = CV(this,k,local_28);
            pdVar4[desired_dimension] = pdVar4[this->m_dim];
          }
        }
      }
      this->m_dim = desired_dimension;
    }
    else {
      iVar1 = this->m_cv_stride[0];
      iVar2 = this->m_cv_stride[1];
      local_6c = desired_dimension;
      if (this->m_is_rat != 0) {
        local_6c = desired_dimension + 1;
      }
      local_5c = iVar2;
      local_58 = iVar1;
      if ((iVar1 < local_6c) && (iVar2 < local_6c)) {
        if (iVar2 < iVar1) {
          local_70 = local_6c * this->m_cv_count[1];
        }
        else {
          local_70 = local_6c;
        }
        local_58 = local_70;
        if (iVar2 < iVar1) {
          local_74 = local_6c;
        }
        else {
          local_74 = local_6c * this->m_cv_count[0];
        }
        local_5c = local_74;
        ReserveCVCapacity(this,local_6c * this->m_cv_count[0] * this->m_cv_count[1]);
      }
      if (iVar2 < iVar1) {
        k = this->m_cv_count[0];
        while (k = k + -1, -1 < k) {
          local_28 = this->m_cv_count[1];
          while (local_28 = local_28 + -1, -1 < local_28) {
            pdVar4 = this->m_cv;
            iVar5 = iVar1 * k + iVar2 * local_28;
            pdVar3 = this->m_cv;
            iVar6 = local_58 * k + local_5c * local_28;
            if (this->m_is_rat != 0) {
              pdVar3[(long)iVar6 + (long)desired_dimension] =
                   pdVar4[(long)iVar5 + (long)this->m_dim];
            }
            for (cv._4_4_ = desired_dimension + -1; this->m_dim <= cv._4_4_;
                cv._4_4_ = cv._4_4_ + -1) {
              pdVar3[(long)iVar6 + (long)cv._4_4_] = 0.0;
            }
            cv._4_4_ = this->m_dim;
            while (cv._4_4_ = cv._4_4_ + -1, -1 < cv._4_4_) {
              pdVar3[(long)iVar6 + (long)cv._4_4_] = pdVar4[(long)iVar5 + (long)cv._4_4_];
            }
          }
        }
      }
      else {
        local_28 = this->m_cv_count[1];
        while (local_28 = local_28 + -1, -1 < local_28) {
          k = this->m_cv_count[0];
          while (k = k + -1, -1 < k) {
            pdVar4 = this->m_cv;
            iVar5 = iVar1 * k + iVar2 * local_28;
            pdVar3 = this->m_cv;
            iVar6 = local_58 * k + local_5c * local_28;
            if (this->m_is_rat != 0) {
              pdVar3[(long)iVar6 + (long)desired_dimension] =
                   pdVar4[(long)iVar5 + (long)this->m_dim];
            }
            for (cv._4_4_ = desired_dimension + -1; this->m_dim <= cv._4_4_;
                cv._4_4_ = cv._4_4_ + -1) {
              pdVar3[(long)iVar6 + (long)cv._4_4_] = 0.0;
            }
            cv._4_4_ = this->m_dim;
            while (cv._4_4_ = cv._4_4_ + -1, -1 < cv._4_4_) {
              pdVar3[(long)iVar6 + (long)cv._4_4_] = pdVar4[(long)iVar5 + (long)cv._4_4_];
            }
          }
        }
      }
      this->m_cv_stride[0] = local_58;
      this->m_cv_stride[1] = local_5c;
      this->m_dim = desired_dimension;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsSurface::ChangeDimension(
          int desired_dimension  //  desired_dimension
          )
{
  bool rc = false;
  int i, j, k;
  if ( desired_dimension < 1 )
    return false;
  if ( desired_dimension == m_dim )
    return true;

  DestroySurfaceTree();

  if ( desired_dimension < m_dim ) 
  {
    if ( m_is_rat ) {
      double* cv;
      for ( i = 0; i < m_cv_count[0]; i++ ) 
      {
        for ( j = 0; j < m_cv_count[1]; j++ ) 
        {
          cv = CV(i,j);
          cv[desired_dimension] = cv[m_dim];
        }
      }
    }
    m_dim = desired_dimension;
    rc = true;
  }
  else 
  {
    const double* old_cv;
    double* new_cv;
    //const int old_cv_size = m_is_rat ? (m_dim + 1) : m_dim;
    const int old_stride0 = m_cv_stride[0];
    const int old_stride1 = m_cv_stride[1];
    const int cv_size = m_is_rat ? (desired_dimension + 1) : desired_dimension;
    int new_stride0 = old_stride0;
    int new_stride1 = old_stride1;
    if ( cv_size > old_stride0 && cv_size > old_stride1 )
    {      
      new_stride0 = (old_stride0 <= old_stride1) ? cv_size : (cv_size*m_cv_count[1]);
      new_stride1 = (old_stride0 <= old_stride1) ? (cv_size*m_cv_count[0]) : cv_size;
      ReserveCVCapacity(cv_size*m_cv_count[0]*m_cv_count[1]);
    }

    if ( old_stride0 <= old_stride1 )
    {
      for ( j = m_cv_count[1]-1; j >= 0; j-- )
      {
        for ( i = m_cv_count[0]-1; i >= 0; i-- )
        {
          old_cv = m_cv + (old_stride0*i + old_stride1*j);
          new_cv = m_cv + (new_stride0*i + new_stride1*j);
          if ( m_is_rat )
          {
            new_cv[desired_dimension] = old_cv[m_dim];
          }
          for ( k = desired_dimension-1; k >= m_dim; k-- )
          {
            new_cv[k] = 0.0;
          }
          for ( k = m_dim-1; k >= 0; k-- )
          {
            new_cv[k] = old_cv[k];
          }
        }
      }
    }
    else
    {
      for ( i = m_cv_count[0]-1; i >= 0; i-- )
      {
        for ( j = m_cv_count[1]-1; j >= 0; j-- )
        {
          old_cv = m_cv + (old_stride0*i + old_stride1*j);
          new_cv = m_cv + (new_stride0*i + new_stride1*j);
          if ( m_is_rat )
          {
            new_cv[desired_dimension] = old_cv[m_dim];
          }
          for ( k = desired_dimension-1; k >= m_dim; k-- )
          {
            new_cv[k] = 0.0;
          }
          for ( k = m_dim-1; k >= 0; k-- )
          {
            new_cv[k] = old_cv[k];
          }
        }
      }
    }
    m_cv_stride[0] = new_stride0;
    m_cv_stride[1] = new_stride1;
    m_dim = desired_dimension;
    rc = true;
  }
  return rc;
}